

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigMan.c
# Opt level: O0

Fraig_NodeVec_t * Fraig_UtilInfoAlloc(int nSize,int nWords,int fClean)

{
  Fraig_NodeVec_t *pFVar1;
  Fraig_Node_t *__s;
  int local_2c;
  int i;
  uint *pUnsigned;
  Fraig_NodeVec_t *vInfo;
  int fClean_local;
  int nWords_local;
  int nSize_local;
  
  if ((0 < nSize) && (0 < nWords)) {
    pFVar1 = Fraig_NodeVecAlloc(nSize);
    __s = (Fraig_Node_t *)malloc((long)(nSize * nWords) << 2);
    *pFVar1->pArray = __s;
    if (fClean != 0) {
      memset(__s,0,(long)nSize * 4 * (long)nWords);
    }
    for (local_2c = 1; local_2c < nSize; local_2c = local_2c + 1) {
      pFVar1->pArray[local_2c] = (Fraig_Node_t *)(&pFVar1->pArray[local_2c + -1]->Num + nWords);
    }
    pFVar1->nSize = nSize;
    return pFVar1;
  }
  __assert_fail("nSize > 0 && nWords > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/fraig/fraigMan.c"
                ,0x18a,"Fraig_NodeVec_t *Fraig_UtilInfoAlloc(int, int, int)");
}

Assistant:

Fraig_NodeVec_t * Fraig_UtilInfoAlloc( int nSize, int nWords, int fClean )
{
    Fraig_NodeVec_t * vInfo;
    unsigned * pUnsigned;
    int i;
    assert( nSize > 0 && nWords > 0 );
    vInfo = Fraig_NodeVecAlloc( nSize );
    pUnsigned = ABC_ALLOC( unsigned, nSize * nWords );
    vInfo->pArray[0] = (Fraig_Node_t *)pUnsigned;
    if ( fClean )
        memset( pUnsigned, 0, sizeof(unsigned) * nSize * nWords );
    for ( i = 1; i < nSize; i++ )
        vInfo->pArray[i] = (Fraig_Node_t *)(((unsigned *)vInfo->pArray[i-1]) + nWords);
    vInfo->nSize = nSize;
    return vInfo;
}